

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O0

void __thiscall wasm::Analyzer::scanChildren(Analyzer *this,Expression *curr)

{
  Index *this_00;
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  Expression **ppEVar4;
  mapped_type *this_01;
  Iterator IVar5;
  byte local_271;
  FindAll<wasm::Call> local_270;
  EffectAnalyzer local_258;
  size_type local_f8;
  size_type useOperandNow;
  StructField structField;
  Expression *operand;
  HeapType HStack_d0;
  Index i;
  HeapType type;
  StructNew *new_;
  Expression *child;
  undefined1 local_a8 [8];
  Iterator __end3;
  undefined1 local_78 [8];
  Iterator __begin3;
  ChildIterator *__range3;
  Expression *local_18;
  Expression *curr_local;
  Analyzer *this_local;
  
  local_271 = 1;
  local_18 = curr;
  curr_local = (Expression *)this;
  if ((this->options->closedWorld & 1U) != 0) {
    __range3._4_4_ = 1;
    bVar1 = wasm::Type::operator==(&curr->type,(BasicType *)((long)&__range3 + 4));
    local_271 = 1;
    if (!bVar1) {
      bVar1 = Expression::is<wasm::StructNew>(local_18);
      local_271 = bVar1 ^ 0xff;
    }
  }
  if ((local_271 & 1) == 0) {
    type.id = (uintptr_t)Expression::cast<wasm::StructNew>(local_18);
    HStack_d0 = wasm::Type::getHeapType
                          (&(((StructNew *)type.id)->
                            super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.
                            type);
    operand._4_4_ = 0;
    while( true ) {
      uVar2 = (ulong)operand._4_4_;
      sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         (type.id + 0x10));
      if (sVar3 <= uVar2) break;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (type.id + 0x10),(ulong)operand._4_4_);
      structField._8_8_ = *ppEVar4;
      std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_unsigned_int_&,_true>
                ((pair<wasm::HeapType,_unsigned_int> *)&useOperandNow,&stack0xffffffffffffff30,
                 (uint *)((long)&operand + 4));
      local_f8 = std::
                 unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                 ::count(&this->readStructFields,(key_type *)&useOperandNow);
      if (local_f8 == 0) {
        EffectAnalyzer::EffectAnalyzer
                  (&local_258,this->options,this->module,(Expression *)structField._8_8_);
        bVar1 = EffectAnalyzer::hasSideEffects(&local_258);
        local_f8 = (size_type)bVar1;
        EffectAnalyzer::~EffectAnalyzer(&local_258);
      }
      if (local_f8 == 0) {
        FindAll<wasm::Call>::FindAll(&local_270,(Expression *)structField._8_8_);
        bVar1 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::empty(&local_270.list);
        local_f8 = (size_type)((bVar1 ^ 0xffU) & 1);
        FindAll<wasm::Call>::~FindAll(&local_270);
      }
      if (local_f8 == 0) {
        this_01 = std::
                  unordered_map<std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<wasm::HeapType,_unsigned_int>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                  ::operator[](&this->unreadStructFieldExprMap,(key_type *)&useOperandNow);
        std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                  (this_01,(value_type *)&structField.second);
        addReferences(this,(Expression *)structField._8_8_);
      }
      else {
        use(this,(Expression *)structField._8_8_);
      }
      operand._4_4_ = operand._4_4_ + 1;
    }
  }
  else {
    this_00 = &__begin3.index;
    ChildIterator::ChildIterator((ChildIterator *)this_00,local_18);
    IVar5 = AbstractChildIterator<wasm::ChildIterator>::begin
                      ((AbstractChildIterator<wasm::ChildIterator> *)this_00);
    __end3._8_8_ = IVar5.parent;
    __begin3.parent._0_4_ = IVar5.index;
    local_78 = (undefined1  [8])__end3._8_8_;
    IVar5 = AbstractChildIterator<wasm::ChildIterator>::end
                      ((AbstractChildIterator<wasm::ChildIterator> *)this_00);
    local_a8 = (undefined1  [8])IVar5.parent;
    __end3.parent._0_4_ = IVar5.index;
    while( true ) {
      bVar1 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                        ((Iterator *)local_78,(Iterator *)local_a8);
      if (!bVar1) break;
      ppEVar4 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                          ((Iterator *)local_78);
      use(this,*ppEVar4);
      AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_78);
    }
    ChildIterator::~ChildIterator((ChildIterator *)&__begin3.index);
  }
  return;
}

Assistant:

void scanChildren(Expression* curr) {
    // For now, the only special handling we have is fields of struct.new, which
    // we defer walking of to when we know there is a read that can actually
    // read them, see comments above on |expressionQueue|. We can only do that
    // optimization in closed world (as otherwise the field might be read
    // outside of the code we can see), and when it is reached (if it's
    // unreachable then we don't know the type, and can defer that to DCE to
    // remove).
    if (!options.closedWorld || curr->type == Type::unreachable ||
        !curr->is<StructNew>()) {
      for (auto* child : ChildIterator(curr)) {
        use(child);
      }
      return;
    }

    auto* new_ = curr->cast<StructNew>();
    auto type = new_->type.getHeapType();

    for (Index i = 0; i < new_->operands.size(); i++) {
      auto* operand = new_->operands[i];
      auto structField = StructField{type, i};

      // If this struct field has already been read, then we should use the
      // contents there now.
      auto useOperandNow = readStructFields.count(structField);

      // Side effects are tricky to reason about - the side effects must happen
      // even if we never read the struct field - so give up and consider it
      // used.
      if (!useOperandNow) {
        useOperandNow =
          EffectAnalyzer(options, *module, operand).hasSideEffects();
      }

      // We must handle the call.without.effects intrinsic here in a special
      // manner. That intrinsic is reported as having no side effects in
      // EffectAnalyzer, but even though for optimization purposes we can ignore
      // effects, the called code *is* actually reached, and it might have side
      // effects. In other words, the point of the intrinsic is to temporarily
      // ignore those effects during one phase of optimization. Or, put another
      // way, the intrinsic lets us ignore the effects of computing some value,
      // but we do still need to compute that value if it is received and used
      // (if it is not received and used, other passes will remove it).
      if (!useOperandNow) {
        // To detect this, look for any call. A non-intrinsic call would have
        // already been detected when we looked for side effects, so this will
        // only notice intrinsic calls.
        useOperandNow = !FindAll<Call>(operand).list.empty();
      }

      if (useOperandNow) {
        use(operand);
      } else {
        // This data does not need to be read now, but might be read later. Note
        // it as unread.
        unreadStructFieldExprMap[structField].push_back(operand);

        // We also must note that anything in this operand is referenced, even
        // if it never ends up used, so the IR remains valid.
        addReferences(operand);
      }
    }
  }